

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::mark_down(Omega_h *this,Graph *l2h,Read<signed_char> *high_marked)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  void *extraout_RDX;
  uint size_in;
  Read<signed_char> RVar4;
  ScopedTimer omega_h_scoped_function_timer;
  allocator local_151;
  Write<signed_char> low_marks_w;
  LOs l2lh;
  string local_130;
  Write<int> local_110;
  Write<signed_char> local_100;
  Write<signed_char> local_f0;
  LOs lh2h;
  type f;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Write<int>::Write(&l2lh.write_,(Write<int> *)l2h);
  Write<int>::Write(&lh2h.write_,&(l2h->ab2b).write_);
  if (((ulong)l2lh.write_.shared_alloc_.alloc & 1) == 0) {
    uVar2 = (l2lh.write_.shared_alloc_.alloc)->size;
  }
  else {
    uVar2 = (ulong)l2lh.write_.shared_alloc_.alloc >> 3;
  }
  std::__cxx11::string::string((string *)&local_130,"",(allocator *)&f);
  iVar1 = (int)(uVar2 >> 2);
  size_in = iVar1 - 1;
  Write<signed_char>::Write(&low_marks_w,size_in,'\0',&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  Write<int>::Write((Write<int> *)&f,&l2lh.write_);
  Write<signed_char>::Write(&f.high_marked.write_,&high_marked->write_);
  Write<int>::Write(&f.lh2h.write_,&lh2h.write_);
  Write<signed_char>::Write(&f.low_marks_w,&low_marks_w);
  std::__cxx11::string::string
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
             ,&local_151);
  std::operator+(&local_50,&local_70,":");
  std::__cxx11::to_string(&local_90,0x54);
  std::operator+(&local_130,&local_50,&local_90);
  begin_code("parallel_for",local_130._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  if (1 < iVar1) {
    entering_parallel = 1;
    Write<int>::Write((Write<int> *)&local_130,(Write<int> *)&f);
    Write<signed_char>::Write((Write<signed_char> *)&local_130.field_2,&f.high_marked.write_);
    Write<int>::Write(&local_110,&f.lh2h.write_);
    Write<signed_char>::Write(&local_100,&f.low_marks_w);
    entering_parallel = 0;
    for (uVar2 = 0; uVar2 != size_in; uVar2 = uVar2 + 1) {
      for (lVar3 = (long)*(int *)(local_130._M_string_length + uVar2 * 4);
          lVar3 < *(int *)(local_130._M_string_length + uVar2 * 4 + 4); lVar3 = lVar3 + 1) {
        if (*(char *)(local_130.field_2._8_8_ +
                     (long)*(int *)((long)local_110.shared_alloc_.direct_ptr + lVar3 * 4)) != '\0')
        {
          *(undefined1 *)((long)local_100.shared_alloc_.direct_ptr + uVar2) = 1;
        }
      }
    }
    mark_down(Omega_h::Graph,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)&local_130);
  }
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  Write<signed_char>::Write(&local_f0,&low_marks_w);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_f0);
  Write<signed_char>::~Write(&local_f0);
  mark_down(Omega_h::Graph,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)&f);
  Write<signed_char>::~Write(&low_marks_w);
  Write<int>::~Write(&lh2h.write_);
  Write<int>::~Write(&l2lh.write_);
  RVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar4.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_down(Graph l2h, Read<I8> high_marked) {
  auto l2lh = l2h.a2ab;
  auto lh2h = l2h.ab2b;
  auto nl = l2lh.size() - 1;
  Write<I8> low_marks_w(nl, 0);
  auto f = OMEGA_H_LAMBDA(LO l) {
    for (LO lh = l2lh[l]; lh < l2lh[l + 1]; ++lh)
      if (high_marked[lh2h[lh]]) low_marks_w[l] = 1;
  };
  parallel_for(nl, std::move(f));
  return low_marks_w;
}